

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

cni_holder_base *
cs_impl::cni::construct_helper<void(*)()>::_construct<void(*&)(),void>
          (_func_void **val,_func_void *target_function)

{
  cni_holder<void_(*)(),_void_(*)()> *this;
  
  this = (cni_holder<void_(*)(),_void_(*)()> *)operator_new(0x28);
  cni_holder<void_(*)(),_void_(*)()>::cni_holder(this,val);
  return &this->super_cni_holder_base;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}